

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.cpp
# Opt level: O2

int mz_compress2(uchar *pDest,mz_ulong *pDest_len,uchar *pSource,mz_ulong source_len,int level)

{
  int iVar1;
  int iVar2;
  mz_stream local_88;
  
  local_88.data_type = 0;
  local_88._92_4_ = 0;
  local_88.adler = 0;
  local_88.zfree = (mz_free_func)0x0;
  local_88.opaque = (void *)0x0;
  local_88.state = (mz_internal_state *)0x0;
  local_88.zalloc = (mz_alloc_func)0x0;
  local_88.total_out = 0;
  local_88.msg = (char *)0x0;
  local_88.total_in = 0;
  local_88.reserved = 0;
  iVar1 = -10000;
  if ((*pDest_len | source_len) >> 0x20 == 0) {
    local_88._8_8_ = source_len & 0xffffffff;
    local_88._32_8_ = *pDest_len & 0xffffffff;
    local_88.next_in = pSource;
    local_88.next_out = pDest;
    iVar1 = mz_deflateInit(&local_88,level);
    if (iVar1 == 0) {
      iVar2 = mz_deflate(&local_88,4);
      if (iVar2 == 1) {
        *pDest_len = local_88.total_out;
        iVar1 = 0;
        if (local_88.state != (mz_internal_state *)0x0) {
          (*local_88.zfree)(local_88.opaque,local_88.state);
        }
      }
      else {
        if (local_88.state != (mz_internal_state *)0x0) {
          (*local_88.zfree)(local_88.opaque,local_88.state);
        }
        iVar1 = -5;
        if (iVar2 != 0) {
          iVar1 = iVar2;
        }
      }
    }
  }
  return iVar1;
}

Assistant:

int mz_compress2(unsigned char *pDest, mz_ulong *pDest_len, const unsigned char *pSource, mz_ulong source_len, int level)
{
    int status;
    mz_stream stream;
    memset(&stream, 0, sizeof(stream));

    /* In case mz_ulong is 64-bits (argh I hate longs). */
    if ((source_len | *pDest_len) > 0xFFFFFFFFU)
        return MZ_PARAM_ERROR;

    stream.next_in = pSource;
    stream.avail_in = (mz_uint32)source_len;
    stream.next_out = pDest;
    stream.avail_out = (mz_uint32)*pDest_len;

    status = mz_deflateInit(&stream, level);
    if (status != MZ_OK)
        return status;

    status = mz_deflate(&stream, MZ_FINISH);
    if (status != MZ_STREAM_END)
    {
        mz_deflateEnd(&stream);
        return (status == MZ_OK) ? MZ_BUF_ERROR : status;
    }

    *pDest_len = stream.total_out;
    return mz_deflateEnd(&stream);
}